

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_exception.h
# Opt level: O0

void __thiscall LumaException::LumaException(LumaException *this,char *message)

{
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *message_local;
  LumaException *this_local;
  
  local_18 = message;
  message_local = (char *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__LumaException_0011bcd0;
  std::__cxx11::string::string((string *)&this->msg);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::__cxx11::string::operator=((string *)&this->msg,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

LumaException( const char *message )
  {
    msg = std::string( message );
  }